

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvram.cpp
# Opt level: O2

QString * phoenixFlashMapGuidToUString(QString *__return_storage_ptr__,EFI_GUID *guid)

{
  bool bVar1;
  char *ch;
  QByteArray baGuid;
  
  QByteArray::QByteArray(&baGuid,(char *)guid,0x10);
  bVar1 = operator==(&baGuid,&NVRAM_PHOENIX_FLASH_MAP_VOLUME_HEADER);
  if (bVar1) {
    ch = "Volume header";
  }
  else {
    bVar1 = operator==(&baGuid,&NVRAM_PHOENIX_FLASH_MAP_MICROCODES_GUID);
    if (bVar1) {
      ch = "Microcodes";
    }
    else {
      bVar1 = operator==(&baGuid,&NVRAM_PHOENIX_FLASH_MAP_CMDB_GUID);
      if (bVar1) {
        ch = "CMDB";
      }
      else {
        bVar1 = operator==(&baGuid,&NVRAM_PHOENIX_FLASH_MAP_PUBKEY1_GUID);
        ch = "SLIC pubkey";
        if (!bVar1) {
          bVar1 = operator==(&baGuid,&NVRAM_PHOENIX_FLASH_MAP_PUBKEY2_GUID);
          if (!bVar1) {
            bVar1 = operator==(&baGuid,&NVRAM_PHOENIX_FLASH_MAP_MARKER1_GUID);
            ch = "SLIC marker";
            if (!bVar1) {
              bVar1 = operator==(&baGuid,&NVRAM_PHOENIX_FLASH_MAP_MARKER2_GUID);
              if (!bVar1) {
                bVar1 = operator==(&baGuid,&NVRAM_PHOENIX_FLASH_MAP_EVSA1_GUID);
                ch = "EVSA store";
                if (!bVar1) {
                  bVar1 = operator==(&baGuid,&NVRAM_PHOENIX_FLASH_MAP_EVSA2_GUID);
                  if (!bVar1) {
                    bVar1 = operator==(&baGuid,&NVRAM_PHOENIX_FLASH_MAP_EVSA3_GUID);
                    if (!bVar1) {
                      bVar1 = operator==(&baGuid,&NVRAM_PHOENIX_FLASH_MAP_EVSA4_GUID);
                      if (!bVar1) {
                        bVar1 = operator==(&baGuid,&NVRAM_PHOENIX_FLASH_MAP_EVSA5_GUID);
                        if (!bVar1) {
                          bVar1 = operator==(&baGuid,&NVRAM_PHOENIX_FLASH_MAP_EVSA6_GUID);
                          if (!bVar1) {
                            bVar1 = operator==(&baGuid,&NVRAM_PHOENIX_FLASH_MAP_EVSA7_GUID);
                            if (!bVar1) {
                              bVar1 = operator==(&baGuid,&NVRAM_PHOENIX_FLASH_MAP_SELF_GUID);
                              if (bVar1) {
                                ch = "Flash map";
                              }
                              else {
                                bVar1 = operator==(&baGuid,&ZERO_GUID);
                                if (bVar1) {
                                  (__return_storage_ptr__->d).d = (Data *)0x0;
                                  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
                                  (__return_storage_ptr__->d).size = 0;
                                  goto LAB_00139b14;
                                }
                                ch = "Unknown";
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  QString::QString(__return_storage_ptr__,ch);
LAB_00139b14:
  QArrayDataPointer<char>::~QArrayDataPointer(&baGuid.d);
  return __return_storage_ptr__;
}

Assistant:

UString phoenixFlashMapGuidToUString(const EFI_GUID & guid)
{
    const UByteArray baGuid((const char*)&guid, sizeof(EFI_GUID));
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_VOLUME_HEADER)        return UString("Volume header");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_MICROCODES_GUID)      return UString("Microcodes");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_CMDB_GUID)            return UString("CMDB");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_PUBKEY1_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_PUBKEY2_GUID)      return UString("SLIC pubkey");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_MARKER1_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_MARKER2_GUID)      return UString("SLIC marker");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA1_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA2_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA3_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA4_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA5_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA6_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA7_GUID)        return UString("EVSA store");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_SELF_GUID)            return UString("Flash map");
    if (baGuid == ZERO_GUID)                                    return UString();
    return UString("Unknown");
}